

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_csr.c
# Opt level: O2

int mbedtls_x509write_csr_der
              (mbedtls_x509write_csr *ctx,uchar *buf,size_t size,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  uchar *start;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  mbedtls_pk_type_t mVar6;
  mbedtls_md_info_t *md_info;
  mbedtls_pk_type_t pk_alg;
  ulong ilen;
  size_t sVar7;
  uchar *c;
  size_t local_cb8;
  uchar *c2;
  size_t sig_oid_len;
  ulong local_ca0;
  uchar *local_c98;
  _func_int_void_ptr_uchar_ptr_size_t *local_c90;
  size_t sig_len;
  char *sig_oid;
  uchar hash [64];
  uchar tmp_buf [2048];
  uchar sig [1024];
  
  sig_oid_len = 0;
  c = sig;
  uVar1 = mbedtls_x509_write_extensions(&c,tmp_buf,ctx->extensions);
  if ((int)uVar1 < 0) {
    return uVar1;
  }
  local_c90 = f_rng;
  if (uVar1 == 0) {
    sVar7 = 0;
  }
  else {
    iVar2 = mbedtls_asn1_write_len(&c,tmp_buf,(ulong)uVar1);
    if (iVar2 < 0) {
      return iVar2;
    }
    uVar3 = mbedtls_asn1_write_tag(&c,tmp_buf,'0');
    if ((int)uVar3 < 0) {
      return uVar3;
    }
    sVar7 = (ulong)uVar3 + (ulong)(iVar2 + uVar1);
    local_cb8 = size;
    uVar1 = mbedtls_asn1_write_len(&c,tmp_buf,sVar7);
    if ((int)uVar1 < 0) {
      return uVar1;
    }
    uVar3 = mbedtls_asn1_write_tag(&c,tmp_buf,'1');
    if ((int)uVar3 < 0) {
      return uVar3;
    }
    uVar4 = mbedtls_asn1_write_oid(&c,tmp_buf,anon_var_dwarf_8186,9);
    if ((int)uVar4 < 0) {
      return uVar4;
    }
    sVar7 = (ulong)uVar4 + sVar7 + uVar3 + (ulong)uVar1;
    uVar1 = mbedtls_asn1_write_len(&c,tmp_buf,sVar7);
    if ((int)uVar1 < 0) {
      return uVar1;
    }
    uVar3 = mbedtls_asn1_write_tag(&c,tmp_buf,'0');
    if ((int)uVar3 < 0) {
      return uVar3;
    }
    sVar7 = sVar7 + uVar3 + (ulong)uVar1;
    size = local_cb8;
  }
  uVar3 = mbedtls_asn1_write_len(&c,tmp_buf,sVar7);
  uVar1 = uVar3;
  if (-1 < (int)uVar3) {
    local_cb8 = size;
    local_c98 = buf;
    uVar4 = mbedtls_asn1_write_tag(&c,tmp_buf,0xa0);
    uVar1 = uVar4;
    if ((-1 < (int)uVar4) &&
       (uVar1 = mbedtls_pk_write_pubkey_der(ctx->key,tmp_buf,(long)c - (long)tmp_buf),
       -1 < (int)uVar1)) {
      local_ca0 = (ulong)uVar1;
      c = c + -local_ca0;
      uVar5 = mbedtls_x509_write_names(&c,tmp_buf,ctx->subject);
      uVar1 = uVar5;
      if ((-1 < (int)uVar5) && (uVar1 = mbedtls_asn1_write_int(&c,tmp_buf,0), -1 < (int)uVar1)) {
        sVar7 = (ulong)uVar1 + (ulong)uVar5 + (ulong)uVar4 + sVar7 + uVar3 + local_ca0;
        uVar3 = mbedtls_asn1_write_len(&c,tmp_buf,sVar7);
        uVar1 = uVar3;
        if ((-1 < (int)uVar3) && (uVar1 = mbedtls_asn1_write_tag(&c,tmp_buf,'0'), -1 < (int)uVar1))
        {
          ilen = sVar7 + uVar1 + (ulong)uVar3;
          md_info = mbedtls_md_info_from_type(ctx->md_alg);
          mbedtls_md(md_info,c,ilen,hash);
          mVar6 = mbedtls_pk_get_type(ctx->key);
          uVar1 = mbedtls_pk_sign(ctx->key,ctx->md_alg,hash,0,sig,&sig_len,local_c90,p_rng);
          if (uVar1 == 0) {
            pk_alg = MBEDTLS_PK_ECDSA;
            if (mVar6 != MBEDTLS_PK_ECKEY) {
              pk_alg = mVar6;
            }
            uVar1 = mbedtls_oid_get_oid_by_sig_alg(pk_alg,ctx->md_alg,&sig_oid,&sig_oid_len);
            start = local_c98;
            if (uVar1 == 0) {
              c2 = local_c98 + local_cb8;
              uVar3 = mbedtls_x509_write_sig(&c2,local_c98,sig_oid,sig_oid_len,sig,sig_len);
              uVar1 = uVar3;
              if (-1 < (int)uVar3) {
                if ((ulong)((long)c2 - (long)start) < ilen) {
                  uVar1 = 0xffffff94;
                }
                else {
                  c2 = c2 + -ilen;
                  memcpy(c2,c,ilen);
                  uVar4 = mbedtls_asn1_write_len(&c2,start,uVar3 + ilen);
                  uVar1 = uVar4;
                  if ((-1 < (int)uVar4) &&
                     (uVar1 = mbedtls_asn1_write_tag(&c2,start,'0'), -1 < (int)uVar1)) {
                    uVar1 = uVar4 + (int)(uVar3 + ilen) + uVar1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar1;
}

Assistant:

int mbedtls_x509write_csr_der( mbedtls_x509write_csr *ctx, unsigned char *buf, size_t size,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng )
{
    int ret;
    const char *sig_oid;
    size_t sig_oid_len = 0;
    unsigned char *c, *c2;
    unsigned char hash[64];
    unsigned char sig[MBEDTLS_MPI_MAX_SIZE];
    unsigned char tmp_buf[2048];
    size_t pub_len = 0, sig_and_oid_len = 0, sig_len;
    size_t len = 0;
    mbedtls_pk_type_t pk_alg;

    /*
     * Prepare data to be signed in tmp_buf
     */
    c = tmp_buf + sizeof( tmp_buf );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_x509_write_extensions( &c, tmp_buf, ctx->extensions ) );

    if( len )
    {
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                        MBEDTLS_ASN1_SEQUENCE ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                        MBEDTLS_ASN1_SET ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_oid( &c, tmp_buf, MBEDTLS_OID_PKCS9_CSR_EXT_REQ,
                                          MBEDTLS_OID_SIZE( MBEDTLS_OID_PKCS9_CSR_EXT_REQ ) ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                        MBEDTLS_ASN1_SEQUENCE ) );
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_CONTEXT_SPECIFIC ) );

    MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_pk_write_pubkey_der( ctx->key,
                                                tmp_buf, c - tmp_buf ) );
    c -= pub_len;
    len += pub_len;

    /*
     *  Subject  ::=  Name
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_x509_write_names( &c, tmp_buf, ctx->subject ) );

    /*
     *  Version  ::=  INTEGER  {  v1(0), v2(1), v3(2)  }
     */
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, tmp_buf, 0 ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, tmp_buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, tmp_buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );

    /*
     * Prepare signature
     */
    mbedtls_md( mbedtls_md_info_from_type( ctx->md_alg ), c, len, hash );

    pk_alg = mbedtls_pk_get_type( ctx->key );
    if( pk_alg == MBEDTLS_PK_ECKEY )
        pk_alg = MBEDTLS_PK_ECDSA;

    if( ( ret = mbedtls_pk_sign( ctx->key, ctx->md_alg, hash, 0, sig, &sig_len,
                         f_rng, p_rng ) ) != 0 ||
        ( ret = mbedtls_oid_get_oid_by_sig_alg( pk_alg, ctx->md_alg,
                                        &sig_oid, &sig_oid_len ) ) != 0 )
    {
        return( ret );
    }

    /*
     * Write data to output buffer
     */
    c2 = buf + size;
    MBEDTLS_ASN1_CHK_ADD( sig_and_oid_len, mbedtls_x509_write_sig( &c2, buf,
                                        sig_oid, sig_oid_len, sig, sig_len ) );

    if( len > (size_t)( c2 - buf ) )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    c2 -= len;
    memcpy( c2, c, len );

    len += sig_and_oid_len;
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c2, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c2, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                 MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}